

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O3

VkBool32 __thiscall
vkb::default_debug_callback
          (vkb *this,VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
          VkDebugUtilsMessageTypeFlagsEXT messageType,
          VkDebugUtilsMessengerCallbackDataEXT *pCallbackData,void *param_4)

{
  undefined4 in_register_00000014;
  long lVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  lVar1 = CONCAT44(in_register_00000014,messageType);
  iVar3 = (int)this;
  if (iVar3 < 0x100) {
    if (iVar3 == 1) {
      pcVar2 = "VERBOSE";
    }
    else if (iVar3 == 0x10) {
      pcVar2 = "INFO";
    }
    else {
LAB_0010a3c4:
      pcVar2 = "UNKNOWN";
    }
  }
  else if (iVar3 == 0x100) {
    pcVar2 = "WARNING";
  }
  else {
    if (iVar3 != 0x1000) goto LAB_0010a3c4;
    pcVar2 = "ERROR";
  }
  switch(messageSeverity) {
  case VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT:
    pcVar4 = "General";
    break;
  case 2:
    pcVar4 = "Validation";
    goto LAB_0010a455;
  case 3:
    pcVar4 = "General | Validation";
    goto LAB_0010a455;
  case 4:
    pcVar4 = "Performance";
    break;
  case 5:
    pcVar4 = "General | Performance";
    break;
  case 6:
    pcVar4 = "Validation | Performance";
    goto LAB_0010a455;
  case 7:
    pcVar4 = "General | Validation | Performance";
LAB_0010a455:
    printf("[%s: %s] - %s\n%s\n",pcVar2,pcVar4,*(undefined8 *)(lVar1 + 0x18),
           *(undefined8 *)(lVar1 + 0x28),pcVar4,messageSeverity);
    return 0;
  default:
    pcVar4 = "Unknown";
    if ((messageSeverity & 2) != 0) goto LAB_0010a455;
  }
  printf("[%s: %s]\n%s\n",pcVar2,pcVar4,*(undefined8 *)(lVar1 + 0x28),param_4,pcVar4,messageSeverity
        );
  return 0;
}

Assistant:

inline VKAPI_ATTR VkBool32 VKAPI_CALL default_debug_callback(VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
    VkDebugUtilsMessageTypeFlagsEXT messageType,
    const VkDebugUtilsMessengerCallbackDataEXT* pCallbackData,
    void*) {
    auto ms = to_string_message_severity(messageSeverity);
    auto mt = to_string_message_type(messageType);
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT) {
        printf("[%s: %s] - %s\n%s\n", ms, mt, pCallbackData->pMessageIdName, pCallbackData->pMessage);
    } else {
        printf("[%s: %s]\n%s\n", ms, mt, pCallbackData->pMessage);
    }

    return VK_FALSE; // Applications must return false here (Except Validation, if return true, will skip calling to driver)
}